

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O1

int cloudDagSize(CloudManager *dd,CloudNode *n)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = 0;
  iVar4 = 0;
  do {
    uVar1 = dd->bitsNode;
    if ((uVar1 >> 0x1c & 1) != 0) {
LAB_0052f0f2:
      return iVar3 + iVar4;
    }
    dd->bitsNode = uVar1 | 0x10000000;
    if (uVar1 == 0xfffffff) {
      iVar3 = 1;
      goto LAB_0052f0f2;
    }
    iVar2 = cloudDagSize(*(CloudManager **)(dd->bitsCache + 2),n);
    dd = (CloudManager *)(*(ulong *)dd->bitsCache & 0xfffffffffffffffe);
    iVar4 = iVar4 + iVar2 + 1;
  } while( true );
}

Assistant:

static int cloudDagSize( CloudManager * dd, CloudNode * n )
{
	int tval, eval;
	if ( cloudNodeIsMarked(n) )
		return 0;
	// set visited flag
	cloudNodeMark(n);
	if ( cloudIsConstant(n) )
		return 1;
	tval = cloudDagSize( dd, cloudT(n) );
	eval = cloudDagSize( dd, Cloud_Regular(cloudE(n)) );
	return tval + eval + 1;

}